

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_minq_index(double maxq,double x3,double x2,double x1,aom_bit_depth_t bit_depth)

{
  undefined4 in_EDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double minqtarget;
  aom_bit_depth_t bit_depth_00;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  if (((in_XMM1_Qa * in_XMM0_Qa + in_XMM2_Qa) * in_XMM0_Qa + in_XMM3_Qa) * in_XMM0_Qa < in_XMM0_Qa)
  {
    in_XMM0_Qa = ((in_XMM1_Qa * in_XMM0_Qa + in_XMM2_Qa) * in_XMM0_Qa + in_XMM3_Qa) * in_XMM0_Qa;
  }
  if (2.0 < in_XMM0_Qa) {
    bit_depth_00 = (aom_bit_depth_t)((ulong)in_XMM0_Qa >> 0x20);
    local_4 = av1_find_qindex((double)CONCAT44(in_EDI,in_stack_ffffffffffffffd0),bit_depth_00,
                              SUB84(in_XMM0_Qa,0),bit_depth_00);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int get_minq_index(double maxq, double x3, double x2, double x1,
                          aom_bit_depth_t bit_depth) {
  const double minqtarget = AOMMIN(((x3 * maxq + x2) * maxq + x1) * maxq, maxq);

  // Special case handling to deal with the step from q2.0
  // down to lossless mode represented by q 1.0.
  if (minqtarget <= 2.0) return 0;

  return av1_find_qindex(minqtarget, bit_depth, 0, QINDEX_RANGE - 1);
}